

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GridRenderCase::init
          (GridRenderCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  char *pcVar2;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_190;
  
  local_190.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &local_190.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Rendering yellow-green grid to ");
  pcVar2 = "fbo";
  if (this->m_flags == 0) {
    pcVar2 = "default frame buffer";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::operator<<((ostream *)this_00,".\n");
  std::operator<<((ostream *)this_00,
                  "Grid cells are in random order, varying grid size and location for each iteration.\n"
                 );
  std::operator<<((ostream *)this_00,
                  "Marking all discardable fragments (fragments outside the bounding box) with a fully saturated blue channel."
                 );
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  iVar1 = BBoxRenderCase::init((BBoxRenderCase *)this,ctx_00);
  return iVar1;
}

Assistant:

void GridRenderCase::init (void)
{
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering yellow-green grid to " << ((m_renderTarget == RENDERTARGET_DEFAULT) ? ("default frame buffer") : ("fbo")) << ".\n"
		<< "Grid cells are in random order, varying grid size and location for each iteration.\n"
		<< "Marking all discardable fragments (fragments outside the bounding box) with a fully saturated blue channel."
		<< tcu::TestLog::EndMessage;

	BBoxRenderCase::init();
}